

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_string *
pugi::impl::anon_unknown_0::xpath_string::from_heap
          (xpath_string *__return_storage_ptr__,char_t *begin,char_t *end,xpath_allocator *alloc)

{
  char_t *pcVar1;
  
  if (begin != end) {
    pcVar1 = duplicate_string(begin,(long)end - (long)begin,alloc);
    if (pcVar1 != (char_t *)0x0) {
      __return_storage_ptr__->_buffer = pcVar1;
      __return_storage_ptr__->_uses_heap = true;
      __return_storage_ptr__->_length_heap = (long)end - (long)begin;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->_buffer = "";
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
}

Assistant:

static xpath_string from_heap(const char_t* begin, const char_t* end, xpath_allocator* alloc)
		{
			assert(begin <= end);

			if (begin == end)
				return xpath_string();

			size_t length = static_cast<size_t>(end - begin);
			const char_t* data = duplicate_string(begin, length, alloc);

			return data ? xpath_string(data, true, length) : xpath_string();
		}